

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,MessageLite *default_value)

{
  int iVar1;
  Extension *pEVar2;
  undefined4 extraout_var;
  MessageLite *pMVar3;
  
  pEVar2 = FindOrNull(this,number);
  pMVar3 = default_value;
  if ((pEVar2 != (Extension *)0x0) &&
     (pMVar3 = (pEVar2->field_0).message_value, (pEVar2->field_0xa & 0x10) != 0)) {
    iVar1 = (*pMVar3->_vptr_MessageLite[3])(pMVar3,default_value);
    return (MessageLite *)CONCAT44(extraout_var,iVar1);
  }
  return pMVar3;
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(
    int number, const MessageLite& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == NULL) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      return extension->lazymessage_value->GetMessage(default_value);
    } else {
      return *extension->message_value;
    }
  }
}